

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O2

void voc_make_obj_name(voccxdef *ctx,char *namebuf,char **cmd,int firstwrd,int lastwrd)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  long lVar4;
  long lVar5;
  
  iVar2 = (int)cmd;
  *namebuf = '\0';
  lVar5 = (long)firstwrd;
  lVar4 = (long)lastwrd;
  while (lVar5 < lVar4) {
    pcVar1 = cmd[lVar5];
    iVar2 = voc_check_special(ctx,pcVar1,iVar2);
    if (iVar2 == 0) {
      strcat(namebuf,pcVar1);
    }
    else {
      vocaddof(ctx,namebuf);
    }
    pcVar1 = cmd[lVar5];
    sVar3 = strlen(pcVar1);
    lVar5 = lVar5 + 1;
    iVar2 = extraout_EDX;
    if (lVar5 < lVar4 && pcVar1[sVar3 - 1] == '.') {
      sVar3 = strlen(namebuf);
      (namebuf + sVar3)[0] = '\\';
      (namebuf + sVar3)[1] = '\0';
      iVar2 = extraout_EDX_00;
    }
    if (lVar5 < lVar4) {
      sVar3 = strlen(namebuf);
      (namebuf + sVar3)[0] = ' ';
      (namebuf + sVar3)[1] = '\0';
      iVar2 = extraout_EDX_01;
    }
  }
  return;
}

Assistant:

void voc_make_obj_name(voccxdef *ctx, char *namebuf, char *cmd[],
                       int firstwrd, int lastwrd)
{
    int i;
    
    /* run through the range of words, and add them to the buffer */
    for (i = firstwrd, namebuf[0] = '\0' ; i < lastwrd ; ++i)
    {
        if (voc_check_special(ctx, cmd[i], VOCW_OF))
            vocaddof(ctx, namebuf);
        else
            strcat(namebuf, cmd[i]);
        
        if (cmd[i][strlen(cmd[i])-1] == '.' && i + 1 < lastwrd)
            strcat(namebuf, "\\");

        if (i + 1 < lastwrd)
            strcat(namebuf, " ");
    }
}